

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_is_null.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformNullTest(Transformer *this,PGNullTest *root)

{
  type expr;
  NotImplementedException *this_00;
  long in_RDX;
  ExpressionType expr_type;
  undefined1 local_40 [8];
  string local_38;
  
  TransformExpression((Transformer *)local_40,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
  if (*(char *)(in_RDX + 0x14) != '\x01') {
    expr_type = *(int *)(in_RDX + 0x10) == 0 ^ OPERATOR_IS_NOT_NULL;
    make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((duckdb *)(local_40 + 8),&expr_type,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_40);
    expr = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
           ::operator*((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                        *)(local_40 + 8));
    SetQueryLocation(&expr->super_ParsedExpression,*(int *)(in_RDX + 0x18));
    (this->parent).ptr = (Transformer *)local_38._M_dataplus._M_p;
    if (local_40 != (undefined1  [8])0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_40)->ptr->options)();
    }
    return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           this;
  }
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)(local_40 + 8),"IS NULL argisrow",(allocator *)&expr_type);
  NotImplementedException::NotImplementedException(this_00,(string *)(local_40 + 8));
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformNullTest(duckdb_libpgquery::PGNullTest &root) {
	auto arg = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(root.arg));
	if (root.argisrow) {
		throw NotImplementedException("IS NULL argisrow");
	}
	ExpressionType expr_type = (root.nulltesttype == duckdb_libpgquery::PG_IS_NULL)
	                               ? ExpressionType::OPERATOR_IS_NULL
	                               : ExpressionType::OPERATOR_IS_NOT_NULL;

	auto result = make_uniq<OperatorExpression>(expr_type, std::move(arg));
	SetQueryLocation(*result, root.location);
	return std::move(result);
}